

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O2

void __thiscall SpookyHash::Update(SpookyHash *this,void *message,size_t length)

{
  SpookyHash *pSVar1;
  ulong uVar2;
  ulong __n;
  uint64 *__src;
  uint64 h7;
  uint64 h6;
  uint64 h3;
  uint64 h0;
  uint64 local_80;
  uint64 h10;
  uint64 h9;
  uint64 local_68;
  uint64 local_60;
  uint64 local_58;
  uint64 local_50;
  size_t local_48;
  uint64 local_40;
  SpookyHash *local_38;
  
  uVar2 = (ulong)this->m_remainder;
  if (uVar2 + length < 0xc0) {
    memcpy((void *)((long)this->m_data + uVar2),message,length);
    this->m_length = this->m_length + length;
    this->m_remainder = (uint8)(uVar2 + length);
  }
  else {
    h0 = this->m_state[0];
    if (this->m_length < 0xc0) {
      local_80 = 0xdeadbeefdeadbeef;
      local_60 = this->m_state[1];
      local_40 = 0xdeadbeefdeadbeef;
      local_68 = 0xdeadbeefdeadbeef;
      local_58 = 0xdeadbeefdeadbeef;
      local_50 = local_60;
      h7 = local_60;
      h6 = h0;
      h3 = h0;
      h10 = local_60;
      h9 = h0;
    }
    else {
      h3 = this->m_state[3];
      local_50 = this->m_state[1];
      local_58 = this->m_state[2];
      h6 = this->m_state[6];
      local_60 = this->m_state[4];
      local_68 = this->m_state[5];
      h7 = this->m_state[7];
      h9 = this->m_state[9];
      local_40 = this->m_state[8];
      h10 = this->m_state[10];
      local_80 = this->m_state[0xb];
    }
    this->m_length = this->m_length + length;
    local_38 = this;
    if (uVar2 != 0) {
      __n = (ulong)(byte)(-this->m_remainder - 0x40);
      local_48 = length;
      memcpy((void *)((long)this->m_data + uVar2),message,__n);
      Mix(this->m_data,&h0,&local_50,&local_58,&h3,&local_60,&local_68,&h6,&h7,&local_40,&h9,&h10,
          &local_80);
      Mix(this->m_data + 0xc,&h0,&local_50,&local_58,&h3,&local_60,&local_68,&h6,&h7,&local_40,&h9,
          &h10,&local_80);
      message = (void *)((long)message + __n);
      length = local_48 - __n;
    }
    local_48 = length % 0x60;
    __src = (uint64 *)((length - local_48) + (long)message);
    for (; pSVar1 = local_38, message < __src; message = (void *)((long)message + 0x60)) {
      Mix((uint64 *)message,&h0,&local_50,&local_58,&h3,&local_60,&local_68,&h6,&h7,&local_40,&h9,
          &h10,&local_80);
    }
    local_38->m_remainder = (uint8)local_48;
    memcpy(local_38,__src,local_48);
    pSVar1->m_state[0] = h0;
    pSVar1->m_state[1] = local_50;
    pSVar1->m_state[2] = local_58;
    pSVar1->m_state[3] = h3;
    pSVar1->m_state[4] = local_60;
    pSVar1->m_state[5] = local_68;
    pSVar1->m_state[6] = h6;
    pSVar1->m_state[7] = h7;
    pSVar1->m_state[8] = local_40;
    pSVar1->m_state[9] = h9;
    pSVar1->m_state[10] = h10;
    pSVar1->m_state[0xb] = local_80;
  }
  return;
}

Assistant:

void SpookyHash::Update(const void *message, size_t length)
{
    uint64 h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11;
    size_t newLength = length + m_remainder;
    uint8  remainder;
    union 
    { 
        const uint8 *p8; 
        uint64 *p64; 
        size_t i; 
    } u;
    const uint64 *end;
    
    // Is this message fragment too short?  If it is, stuff it away.
    if (newLength < sc_bufSize)
    {
        memcpy(&((uint8 *)m_data)[m_remainder], message, length);
        m_length = length + m_length;
        m_remainder = (uint8)newLength;
        return;
    }
    
    // init the variables
    if (m_length < sc_bufSize)
    {
        h0=h3=h6=h9  = m_state[0];
        h1=h4=h7=h10 = m_state[1];
        h2=h5=h8=h11 = sc_const;
    }
    else
    {
        h0 = m_state[0];
        h1 = m_state[1];
        h2 = m_state[2];
        h3 = m_state[3];
        h4 = m_state[4];
        h5 = m_state[5];
        h6 = m_state[6];
        h7 = m_state[7];
        h8 = m_state[8];
        h9 = m_state[9];
        h10 = m_state[10];
        h11 = m_state[11];
    }
    m_length = length + m_length;
    
    // if we've got anything stuffed away, use it now
    if (m_remainder)
    {
        uint8 prefix = sc_bufSize-m_remainder;
        memcpy(&(((uint8 *)m_data)[m_remainder]), message, prefix);
        u.p64 = m_data;
        Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        Mix(&u.p64[sc_numVars], h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
        u.p8 = ((const uint8 *)message) + prefix;
        length -= prefix;
    }
    else
    {
        u.p8 = (const uint8 *)message;
    }
    
    // handle all whole blocks of sc_blockSize bytes
    end = u.p64 + (length/sc_blockSize)*sc_numVars;
    remainder = (uint8)(length-((const uint8 *)end-u.p8));
    if (ALLOW_UNALIGNED_READS || (u.i & 0x7) == 0)
    {
        while (u.p64 < end)
        { 
            Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }
    else
    {
        while (u.p64 < end)
        { 
            memcpy(m_data, u.p8, sc_blockSize);
            Mix(m_data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }

    // stuff away the last few bytes
    m_remainder = remainder;
    memcpy(m_data, end, remainder);
    
    // stuff away the variables
    m_state[0] = h0;
    m_state[1] = h1;
    m_state[2] = h2;
    m_state[3] = h3;
    m_state[4] = h4;
    m_state[5] = h5;
    m_state[6] = h6;
    m_state[7] = h7;
    m_state[8] = h8;
    m_state[9] = h9;
    m_state[10] = h10;
    m_state[11] = h11;
}